

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O2

void __thiscall re2::PrefilterTree::Add(PrefilterTree *this,Prefilter *f)

{
  bool bVar1;
  Prefilter *f_local;
  LogMessageFatal local_190;
  
  f_local = f;
  if (this->compiled_ == true) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter_tree.cc"
               ,0x47);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Add after Compile.");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  else {
    if (f != (Prefilter *)0x0) {
      bVar1 = KeepPart(f,0);
      if (!bVar1) {
        Prefilter::~Prefilter(f);
        operator_delete(f);
        f_local = (Prefilter *)0x0;
      }
    }
    std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::push_back
              (&this->prefilter_vec_,&f_local);
  }
  return;
}

Assistant:

void PrefilterTree::Add(Prefilter *f) {
  if (compiled_) {
    LOG(DFATAL) << "Add after Compile.";
    return;
  }
  if (f != NULL && !KeepPart(f, 0)) {
    delete f;
    f = NULL;
  }

  prefilter_vec_.push_back(f);
}